

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTable.hh
# Opt level: O2

void __thiscall
ObjTable<QPDFWriter::NewObject>::resize(ObjTable<QPDFWriter::NewObject> *this,size_t a_size)

{
  int *piVar1;
  ulong uVar2;
  pointer pNVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  undefined8 uVar6;
  iterator __position;
  size_t sVar7;
  
  std::vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>::resize
            (&this->super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>,
             a_size);
  if (this->min_sparse < a_size) {
    sVar7 = 0xffffffffffffffff;
    for (__position._M_node =
              (this->sparse_elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)__position._M_node !=
        &(this->sparse_elements)._M_t._M_impl.super__Rb_tree_header;
        __position = std::
                     _Rb_tree<unsigned_long,std::pair<unsigned_long_const,QPDFWriter::NewObject>,std::_Select1st<std::pair<unsigned_long_const,QPDFWriter::NewObject>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,QPDFWriter::NewObject>>>
                     ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,QPDFWriter::NewObject>,std::_Select1st<std::pair<unsigned_long_const,QPDFWriter::NewObject>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,QPDFWriter::NewObject>>>
                                         *)&this->sparse_elements,__position)) {
      uVar2 = *(ulong *)(__position._M_node + 1);
      if (a_size <= uVar2) {
        sVar7 = *(size_t *)(__position._M_node + 1);
        break;
      }
      pNVar3 = (this->super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>).
               super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>.
               _M_impl.super__Vector_impl_data._M_start;
      p_Var4 = __position._M_node[1]._M_parent;
      p_Var5 = __position._M_node[1]._M_left;
      uVar6 = *(undefined8 *)(__position._M_node + 2);
      piVar1 = &pNVar3[uVar2].xref.field2;
      *(_Base_ptr *)piVar1 = __position._M_node[1]._M_right;
      *(undefined8 *)(piVar1 + 2) = uVar6;
      pNVar3 = pNVar3 + uVar2;
      *(_Base_ptr *)&pNVar3->xref = p_Var4;
      (pNVar3->xref).field1 = (qpdf_offset_t)p_Var5;
    }
    this->min_sparse = sVar7;
  }
  return;
}

Assistant:

void
    resize(size_t a_size)
    {
        std::vector<T>::resize(a_size);
        if (a_size > min_sparse) {
            auto it = sparse_elements.begin();
            auto end = sparse_elements.end();
            while (it != end && it->first < a_size) {
                std::vector<T>::operator[](it->first) = std::move(it->second);
                it = sparse_elements.erase(it);
            }
            min_sparse = (it == end) ? std::numeric_limits<size_t>::max() : it->first;
        }
    }